

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DisjunctionPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  EncodedChar EVar1;
  int depth_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  AlternativePass0(this,depth);
  while( true ) {
    EVar1 = ECLookahead(this,0);
    if (EVar1 != '|') break;
    ECConsume(this,1);
    AlternativePass0(this,depth);
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::DisjunctionPass0(int depth)
    {
        AlternativePass0(depth);
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return;
            ECConsume();
            AlternativePass0(depth);
        }
    }